

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

CURLcode smtp_statemach_act(connectdata *conn)

{
  anon_union_224_10_26c073a1_for_proto *pp;
  uint *puVar1;
  curl_socket_t sockfd;
  imapstate iVar2;
  curl_usessl cVar3;
  Curl_easy *pCVar4;
  void *pvVar5;
  uint uVar6;
  _Bool _Var7;
  CURLcode CVar8;
  uint uVar9;
  size_t sVar10;
  ulong uVar11;
  ulong maxlen;
  char *pcVar12;
  Curl_easy *pCVar13;
  smtp_conn *smtpc;
  char *pcVar14;
  long lVar15;
  bool bVar16;
  int smtpcode;
  size_t nread;
  saslprogress local_50;
  undefined4 uStack_4c;
  uint local_44;
  SASL *local_40;
  size_t local_38;
  
  sockfd = conn->sock[0];
  pCVar4 = conn->data;
  local_38 = 0;
  if ((conn->proto).imapc.state == IMAP_AUTHENTICATE) {
    CVar8 = smtp_perform_upgrade_tls(conn);
    return CVar8;
  }
  pp = &conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar8 = Curl_pp_flushsend(&(pp->ftpc).pp);
    return CVar8;
  }
  local_40 = (SASL *)&(conn->proto).imapc.sasl.state;
  do {
    CVar8 = Curl_pp_readresp(sockfd,&(pp->ftpc).pp,(int *)&local_44,&local_38);
    uVar6 = local_44;
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    iVar2 = (conn->proto).imapc.state;
    if (local_44 != 1 && iVar2 != IMAP_APPEND_FINAL) {
      (pCVar4->info).httpcode = local_44;
    }
    if (local_44 == 0) {
      return CURLE_OK;
    }
    switch(iVar2) {
    case IMAP_SERVERGREET:
      if (local_44 - 200 < 100) {
        CVar8 = smtp_perform_ehlo(conn);
      }
      else {
        Curl_failf(conn->data,"Got unexpected smtp-server response: %d",(ulong)local_44);
        CVar8 = CURLE_FTP_WEIRD_SERVER_REPLY;
      }
      break;
    case IMAP_CAPABILITY:
      pCVar13 = conn->data;
      if (local_44 - 300 < 0xffffff9c && local_44 != 1) {
        if ((CURLUSESSL_TRY < (pCVar13->set).use_ssl) && (conn->ssl[0].use != true))
        goto LAB_0013fd5d;
        *(undefined4 *)((long)&conn->proto + 0x94) = 0;
        CVar8 = Curl_pp_sendf(&(pp->ftpc).pp,"HELO %s",(conn->proto).ftpc.dirs);
        if (CVar8 == CURLE_OK) {
          (conn->proto).imapc.state = IMAP_STARTTLS;
        }
      }
      else {
        sVar10 = strlen((pCVar13->state).buffer);
        uVar11 = sVar10 - 4;
        if ((uVar11 < 8) || (*(long *)((pCVar13->state).buffer + 4) != 0x534c545452415453)) {
          if ((uVar11 < 4) || (*(int *)((pCVar13->state).buffer + 4) != 0x455a4953)) {
            if ((4 < uVar11) &&
               ((pCVar13->state).buffer[8] == ' ' &&
                *(int *)((pCVar13->state).buffer + 4) == 0x48545541)) {
              (conn->proto).imapc.resptag[2] = '\x01';
              lVar15 = sVar10 - 9;
              pcVar12 = (pCVar13->state).buffer + 9;
LAB_0013fe31:
              bVar16 = lVar15 == 0;
              pcVar14 = pcVar12;
              if (!bVar16) {
                pcVar14 = pcVar12 + lVar15;
                lVar15 = -lVar15;
                bVar16 = false;
                do {
                  if ((0x20 < (ulong)(byte)*pcVar12) ||
                     ((0x100002600U >> ((ulong)(byte)*pcVar12 & 0x3f) & 1) == 0)) {
                    uVar11 = 0;
                    goto LAB_0013fe84;
                  }
                  pcVar12 = pcVar12 + 1;
                  lVar15 = lVar15 + 1;
                  bVar16 = lVar15 == 0;
                } while (!bVar16);
              }
              lVar15 = 0;
              goto LAB_0013fe71;
            }
          }
          else {
            (conn->proto).imapc.resptag[1] = '\x01';
          }
        }
        else {
          (conn->proto).ftpc.transfertype = '\x01';
        }
LAB_0013fffc:
        CVar8 = CURLE_OK;
        if (uVar6 != 1) {
          cVar3 = (pCVar13->set).use_ssl;
          if ((cVar3 != CURLUSESSL_NONE) && (conn->ssl[0].use == false)) {
            if ((conn->proto).ftpc.transfertype == '\x01') {
              CVar8 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","STARTTLS");
              if (CVar8 == CURLE_OK) {
                (conn->proto).imapc.state = IMAP_UPGRADETLS;
              }
              break;
            }
            if (cVar3 != CURLUSESSL_TRY) {
              Curl_failf(pCVar13,"STARTTLS not supported.");
              goto LAB_0013ff09;
            }
          }
LAB_00140022:
          CVar8 = smtp_perform_authentication(conn);
        }
      }
      break;
    case IMAP_STARTTLS:
      if (local_44 - 200 < 100) goto switchD_0013fafa_caseD_5;
      pCVar13 = conn->data;
LAB_0013fd5d:
      Curl_failf(pCVar13,"Remote access denied: %d",(ulong)local_44);
      CVar8 = CURLE_REMOTE_ACCESS_DENIED;
      break;
    case IMAP_UPGRADETLS:
      if (local_44 == 0xdc) {
        CVar8 = smtp_perform_upgrade_tls(conn);
      }
      else {
        if ((conn->data->set).use_ssl == CURLUSESSL_TRY) goto LAB_00140022;
        Curl_failf(conn->data,"STARTTLS denied. %c",(ulong)local_44);
LAB_0013ff09:
        CVar8 = CURLE_USE_SSL_FAILED;
      }
      break;
    default:
switchD_0013fafa_caseD_5:
      (conn->proto).imapc.state = IMAP_STOP;
      goto LAB_0013fb35;
    case IMAP_LOGIN:
      pCVar13 = conn->data;
      CVar8 = Curl_sasl_continue(local_40,conn,local_44,&local_50);
      if (CVar8 == CURLE_OK) {
        if (local_50 == SASL_IDLE) {
          Curl_failf(pCVar13,"Authentication cancelled");
          CVar8 = CURLE_LOGIN_DENIED;
        }
        else {
          CVar8 = CURLE_OK;
          if (local_50 == SASL_DONE) {
LAB_0013ff94:
            (conn->proto).imapc.state = IMAP_STOP;
          }
        }
      }
      break;
    case IMAP_LIST:
      pCVar13 = conn->data;
      pvVar5 = (pCVar13->req).protop;
      pcVar12 = (pCVar13->state).buffer;
      sVar10 = strlen(pcVar12);
      if (((((uVar6 - 300 < 0xffffff9c) && (*(long *)((long)pvVar5 + 0x10) != 0)) &&
           (uVar6 != 0x229)) && (uVar6 != 1)) ||
         (((uVar6 - 300 < 0xffffff9c && (uVar6 != 1)) && (*(long *)((long)pvVar5 + 0x10) == 0)))) {
        Curl_failf(pCVar13,"Command failed: %d",(ulong)uVar6);
        CVar8 = CURLE_RECV_ERROR;
      }
      else {
        CVar8 = CURLE_OK;
        if ((pCVar13->set).opt_no_body == false) {
          pcVar12[sVar10] = '\n';
          CVar8 = Curl_client_write(conn,1,pcVar12,sVar10 + 1);
          pcVar12[sVar10] = '\0';
        }
        if (uVar6 != 1) {
          if ((*(long *)((long)pvVar5 + 0x10) == 0) ||
             (lVar15 = *(long *)(*(long *)((long)pvVar5 + 0x10) + 8),
             *(long *)((long)pvVar5 + 0x10) = lVar15, lVar15 == 0)) goto LAB_0013ff94;
          CVar8 = smtp_perform_command(conn);
        }
      }
      break;
    case IMAP_SELECT:
      if (local_44 - 200 < 100) {
LAB_0013fc89:
        CVar8 = smtp_perform_rcpt_to(conn);
      }
      else {
        pCVar13 = conn->data;
        pcVar12 = "MAIL failed: %d";
LAB_0013ff1b:
        Curl_failf(pCVar13,pcVar12,(ulong)local_44);
        CVar8 = CURLE_SEND_ERROR;
      }
      break;
    case IMAP_FETCH:
      pCVar13 = conn->data;
      if (99 < local_44 - 200) {
        pcVar12 = "RCPT failed: %d";
        goto LAB_0013ff1b;
      }
      pvVar5 = (pCVar13->req).protop;
      lVar15 = *(long *)(*(long *)((long)pvVar5 + 0x10) + 8);
      *(long *)((long)pvVar5 + 0x10) = lVar15;
      if (lVar15 != 0) goto LAB_0013fc89;
      CVar8 = Curl_pp_sendf(&(pp->ftpc).pp,"%s","DATA");
      if (CVar8 != CURLE_OK) break;
      (conn->proto).imapc.state = IMAP_FETCH_FINAL;
LAB_0013fb35:
      CVar8 = CURLE_OK;
      break;
    case IMAP_FETCH_FINAL:
      pCVar13 = conn->data;
      if (local_44 != 0x162) {
        pcVar12 = "DATA failed: %d";
        goto LAB_0013ff1b;
      }
      Curl_pgrsSetUploadSize(pCVar13,(pCVar13->state).infilesize);
      CVar8 = CURLE_OK;
      Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,0,(curl_off_t *)0x0);
      goto LAB_0013fd4b;
    case IMAP_APPEND:
      CVar8 = CURLE_RECV_ERROR;
      if (local_44 == 0xfa) {
        CVar8 = CURLE_OK;
      }
LAB_0013fd4b:
      (conn->proto).imapc.state = IMAP_STOP;
    }
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    if ((conn->proto).imapc.state == IMAP_STOP) {
      return CURLE_OK;
    }
    _Var7 = Curl_pp_moredata(&(pp->ftpc).pp);
    if (!_Var7) {
      return CURLE_OK;
    }
  } while( true );
  while (uVar11 = uVar11 + 1, maxlen = -lVar15, uVar11 < (ulong)-lVar15) {
LAB_0013fe84:
    if (((ulong)(byte)pcVar12[uVar11] < 0x21) &&
       (maxlen = uVar11, (0x100002600U >> ((ulong)(byte)pcVar12[uVar11] & 0x3f) & 1) != 0)) break;
  }
  uVar9 = Curl_sasl_decode_mech(pcVar12,maxlen,(size_t *)&local_50);
  if ((uVar9 != 0) && (CONCAT44(uStack_4c,local_50) == maxlen)) {
    puVar1 = (uint *)((long)&conn->proto + 0x8c);
    *puVar1 = *puVar1 | uVar9;
  }
  pcVar14 = pcVar12 + maxlen;
  lVar15 = -(lVar15 + maxlen);
LAB_0013fe71:
  pcVar12 = pcVar14;
  if (bVar16) goto LAB_0013fffc;
  goto LAB_0013fe31;
}

Assistant:

static CURLcode smtp_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  struct Curl_easy *data = conn->data;
  int smtpcode;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  struct pingpong *pp = &smtpc->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not SMTP */
  if(smtpc->state == SMTP_UPGRADETLS)
    return smtp_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &smtpcode, &nread);
    if(result)
      return result;

    /* Store the latest response for later retrieval if necessary */
    if(smtpc->state != SMTP_QUIT && smtpcode != 1)
      data->info.httpcode = smtpcode;

    if(!smtpcode)
      break;

    /* We have now received a full SMTP server response */
    switch(smtpc->state) {
    case SMTP_SERVERGREET:
      result = smtp_state_servergreet_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_EHLO:
      result = smtp_state_ehlo_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_HELO:
      result = smtp_state_helo_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_STARTTLS:
      result = smtp_state_starttls_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_AUTH:
      result = smtp_state_auth_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_COMMAND:
      result = smtp_state_command_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_MAIL:
      result = smtp_state_mail_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_RCPT:
      result = smtp_state_rcpt_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_DATA:
      result = smtp_state_data_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_POSTDATA:
      result = smtp_state_postdata_resp(conn, smtpcode, smtpc->state);
      break;

    case SMTP_QUIT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, SMTP_STOP);
      break;
    }
  } while(!result && smtpc->state != SMTP_STOP && Curl_pp_moredata(pp));

  return result;
}